

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

Box<Dims> *
adios2::helper::StartEndBox(Box<Dims> *__return_storage_ptr__,Dims *start,Dims *count,bool reverse)

{
  pointer puVar1;
  pointer puVar2;
  iterator __position;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  pointer puVar5;
  long lVar6;
  size_type __n;
  unsigned_long local_38;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&__return_storage_ptr__->first,start);
  puVar1 = (start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1 >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->second,__n);
  if (puVar2 != puVar1) {
    lVar6 = 0;
    do {
      local_38 = ((start->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start[lVar6] +
                 (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar6]) - 1;
      __position._M_current =
           (__return_storage_ptr__->second).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&__return_storage_ptr__->second,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->second).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar6 = lVar6 + 1;
    } while (__n + (__n == 0) != lVar6);
  }
  if (reverse) {
    puVar1 = (__return_storage_ptr__->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = puVar2 + -1;
    if (puVar1 < puVar5 && puVar1 != puVar2) {
      do {
        puVar4 = puVar1 + 1;
        uVar3 = *puVar1;
        *puVar1 = *puVar5;
        *puVar5 = uVar3;
        puVar5 = puVar5 + -1;
        puVar1 = puVar4;
      } while (puVar4 < puVar5);
    }
    puVar1 = (__return_storage_ptr__->second).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->second).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = puVar2 + -1;
    if (puVar1 < puVar5 && puVar1 != puVar2) {
      do {
        puVar4 = puVar1 + 1;
        uVar3 = *puVar1;
        *puVar1 = *puVar5;
        *puVar5 = uVar3;
        puVar5 = puVar5 + -1;
        puVar1 = puVar4;
      } while (puVar4 < puVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> StartEndBox(const Dims &start, const Dims &count, const bool reverse) noexcept
{
    Box<Dims> box;
    box.first = start;
    const size_t size = start.size();
    box.second.reserve(size);

    for (size_t d = 0; d < size; ++d)
    {
        box.second.push_back(start[d] + count[d] - 1); // end inclusive
    }

    if (reverse)
    {
        std::reverse(box.first.begin(), box.first.end());
        std::reverse(box.second.begin(), box.second.end());
    }

    return box;
}